

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btDbvtBroadphase.cpp
# Opt level: O0

void __thiscall
btDbvtBroadphase::rayTest
          (btDbvtBroadphase *this,btVector3 *rayFrom,btVector3 *rayTo,
          btBroadphaseRayCallback *rayCallback,btVector3 *aabbMin,btVector3 *aabbMax)

{
  BroadphaseRayTester callback;
  btVector3 *in_stack_00000070;
  btDbvtNode *in_stack_00000078;
  btDbvt *in_stack_00000080;
  btVector3 *in_stack_00000090;
  btVector3 *in_stack_00000098;
  ICollide *in_stack_000000a0;
  btBroadphaseRayCallback *in_stack_ffffffffffffff88;
  BroadphaseRayTester *in_stack_ffffffffffffff90;
  
  BroadphaseRayTester::BroadphaseRayTester(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  btDbvt::rayTestInternal
            (in_stack_00000080,in_stack_00000078,in_stack_00000070,(btVector3 *)this,rayFrom,
             (uint *)rayTo,rayCallback._4_4_,in_stack_00000090,in_stack_00000098,in_stack_000000a0);
  btDbvt::rayTestInternal
            (in_stack_00000080,in_stack_00000078,in_stack_00000070,(btVector3 *)this,rayFrom,
             (uint *)rayTo,rayCallback._4_4_,in_stack_00000090,in_stack_00000098,in_stack_000000a0);
  BroadphaseRayTester::~BroadphaseRayTester((BroadphaseRayTester *)0x1611e0);
  return;
}

Assistant:

void	btDbvtBroadphase::rayTest(const btVector3& rayFrom,const btVector3& rayTo, btBroadphaseRayCallback& rayCallback,const btVector3& aabbMin,const btVector3& aabbMax)
{
	BroadphaseRayTester callback(rayCallback);

	m_sets[0].rayTestInternal(	m_sets[0].m_root,
		rayFrom,
		rayTo,
		rayCallback.m_rayDirectionInverse,
		rayCallback.m_signs,
		rayCallback.m_lambda_max,
		aabbMin,
		aabbMax,
		callback);

	m_sets[1].rayTestInternal(	m_sets[1].m_root,
		rayFrom,
		rayTo,
		rayCallback.m_rayDirectionInverse,
		rayCallback.m_signs,
		rayCallback.m_lambda_max,
		aabbMin,
		aabbMax,
		callback);

}